

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GyroscopeSensor.cpp
# Opt level: O2

void __thiscall iDynTree::GyroscopeSensor::~GyroscopeSensor(GyroscopeSensor *this)

{
  GyroscopePrivateAttributes *this_00;
  
  (this->super_LinkSensor).super_Sensor._vptr_Sensor = (_func_int **)&PTR__GyroscopeSensor_001e6a18;
  this_00 = this->pimpl;
  if (this_00 != (GyroscopePrivateAttributes *)0x0) {
    GyroscopePrivateAttributes::~GyroscopePrivateAttributes(this_00);
  }
  operator_delete(this_00,0xa8);
  LinkSensor::~LinkSensor(&this->super_LinkSensor);
  return;
}

Assistant:

GyroscopeSensor::~GyroscopeSensor()
{
    delete this->pimpl;
}